

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_notell(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *__format;
  char *pcVar4;
  char buf [4608];
  char arg [4608];
  char acStack_2418 [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    pcVar4 = "Notell whom?";
  }
  else {
    ch_00 = get_char_world(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar4 = "They aren\'t here.\n\r";
    }
    else {
      iVar2 = get_trust(ch_00);
      iVar3 = get_trust(ch);
      if (iVar2 < iVar3) {
        uVar1 = ch_00->comm[0];
        if (((uint)uVar1 >> 0x15 & 1) == 0) {
          ch_00->comm[0] = uVar1 | 0x200000;
          send_to_char("You can\'t tell!\n\r",ch_00);
          send_to_char("NOTELL set.\n\r",ch);
          pcVar4 = ch_00->name;
          __format = "$N revokes %s\'s tells.";
        }
        else {
          ch_00->comm[0] = uVar1 & 0xffffffffffdfffff;
          send_to_char("You can tell again.\n\r",ch_00);
          send_to_char("NOTELL removed.\n\r",ch);
          pcVar4 = ch_00->name;
          __format = "$N restores tells to %s.";
        }
        sprintf(acStack_2418,__format,pcVar4);
        wiznet(acStack_2418,ch,(OBJ_DATA *)0x0,9,0xc,0);
        return;
      }
      pcVar4 = "You failed.\n\r";
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_notell(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Notell whom?", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_NOTELL))
	{
		REMOVE_BIT(victim->comm, COMM_NOTELL);

		send_to_char("You can tell again.\n\r", victim);
		send_to_char("NOTELL removed.\n\r", ch);

		sprintf(buf, "$N restores tells to %s.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
	else
	{
		SET_BIT(victim->comm, COMM_NOTELL);

		send_to_char("You can't tell!\n\r", victim);
		send_to_char("NOTELL set.\n\r", ch);

		sprintf(buf, "$N revokes %s's tells.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
}